

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOPofR.cpp
# Opt level: O2

void __thiscall OpenMD::BOPofR::initializeHistogram(BOPofR *this)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  uint i;
  ulong uVar4;
  
  piVar1 = (this->RCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->WofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->QofR_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar4 = 0; uVar4 < (this->super_StaticAnalyser).nBins_; uVar4 = uVar4 + 1) {
    piVar1[uVar4] = 0;
    piVar2[uVar4] = 0;
    piVar3[uVar4] = 0;
  }
  return;
}

Assistant:

void BOPofR::initializeHistogram() {
    for (unsigned int i = 0; i < nBins_; i++) {
      RCount_[i] = 0;
      WofR_[i]   = 0;
      QofR_[i]   = 0;
    }
  }